

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

int __thiscall
kratos::Generator::clone(Generator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *param_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  Generator *this_00;
  string *psVar2;
  _func_int **pp_Var3;
  element_type *this_01;
  undefined1 auVar4 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  char cVar6;
  byte bVar7;
  uint32_t width;
  _Rb_tree_node_base *p_Var8;
  Port *this_02;
  _Rb_tree_node_base *p_Var9;
  undefined1 local_b0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  shared_ptr<kratos::Param> param;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [8];
  shared_ptr<kratos::Port> port;
  
  (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::Generator,std::allocator<kratos::Generator>,kratos::Context*&,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_IRNode).fn_name_ln,
             (Generator **)this,(allocator<kratos::Generator> *)local_b0,(Context **)(__fn + 0xf8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 0x78));
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::Generator,kratos::Generator>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)this,
             (Generator *)(this->super_IRNode)._vptr_IRNode);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(__fn + 0x130));
  p_Var8 = *(_Rb_tree_node_base **)(__fn + 0x178);
  p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (p_Var8 != (_Rb_tree_node_base *)(__fn + 0x168)) {
    this_00 = (Generator *)(this->super_IRNode)._vptr_IRNode;
    port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var9;
    width = (**(code **)(**(long **)(p_Var8 + 2) + 0x38))();
    parameter(this_00,(string *)(p_Var8 + 1),width,*(bool *)(*(long *)(p_Var8 + 2) + 0xf0));
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (p_Var9 != (_Rb_tree_node_base *)&port_names) {
    do {
      get_port((Generator *)local_50,(string *)__fn);
      this_02 = Generator::port((Generator *)
                                (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base,
                                *(PortDirection *)((long)local_50 + 0x270),(string *)(p_Var9 + 1),
                                *(uint32_t *)((long)local_50 + 0x98),
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                ((long)local_50 + 0xa0),*(PortType *)((long)local_50 + 0x274),
                                *(bool *)((long)local_50 + 0xf0));
      auVar4 = local_50;
      if ((*(_func_int **)((long)local_50 + 0x1e8) != (_func_int *)0x0) &&
         (cVar6 = (**(code **)(*(long *)*(_func_int **)((long)local_50 + 0x1e8) + 0xd8))(),
         cVar6 != '\0')) {
        psVar2 = (string *)
                 (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
        param_00 = &param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        (**(code **)(*(long *)*(_func_int **)((long)auVar4 + 0x1e8) + 0xf8))(param_00);
        get_param((Generator *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar2);
        if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            &local_60) {
          operator_delete(param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,(long)local_60._vptr__Sp_counted_base + 1);
        }
        this_01 = param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &((param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Const).super_Var.super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &((param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Const).super_Var.super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Var::set_width_param(&this_02->super_Var,(shared_ptr<kratos::Var> *)param_00);
        if (this_01 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      bVar7 = (**(code **)(*(_func_int **)local_50 + 0xc0))();
      (*(this_02->super_Var).super_IRNode._vptr_IRNode[0x19])(this_02,(ulong)bVar7);
      if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)&port_names);
  }
  _Var5._M_pi = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (*(long *)(__fn + 8) != *(long *)(__fn + 0x10)) {
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1),
               (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
               ->_vptr__Sp_counted_base[2]);
  }
  pp_Var3 = (_Var5._M_pi)->_vptr__Sp_counted_base;
  *(undefined1 *)((long)pp_Var3 + 0x2d9) = 1;
  *(undefined1 *)(pp_Var3 + 99) = 1;
  pp_Var3[0x89] = (_func_int *)__fn;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  return (int)_Var5._M_pi;
}

Assistant:

std::shared_ptr<Generator> Generator::clone() {
    auto generator = std::make_shared<Generator>(context_, name);
    auto port_names = get_port_names();
    // also parameters
    for (auto const &[param_name, param] : params_) {
        generator->parameter(param_name, param->width(), param->is_signed());
    }

    for (auto const &port_name : port_names) {
        auto port = get_port(port_name);
        auto &p = generator->port(port->port_direction(), port_name, port->var_width(),
                                  port->size(), port->port_type(), port->is_signed());
        if (port->width_param() && port->width_param()->is_param()) {
            auto param = generator->get_param(port->width_param()->to_string());
            p.set_width_param(param);
        }
        p.set_is_packed(port->is_packed());
    }

    if (!fn_name_ln.empty()) {
        generator->fn_name_ln.insert(generator->fn_name_ln.end(), fn_name_ln.begin(),
                                     fn_name_ln.end());
    }
    // we won't bother checking stuff
    generator->set_external(true);
    generator->is_cloned_ = true;
    generator->def_instance_ = this;
    return generator;
}